

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

TempBufferPoolReservation * __thiscall
duckdb::StandardBufferManager::EvictBlocksOrThrow<char_const*,std::__cxx11::string>
          (TempBufferPoolReservation *__return_storage_ptr__,StandardBufferManager *this,
          MemoryTag tag,idx_t memory_delta,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer,
          char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1)

{
  BufferPool *pBVar1;
  StringUtil *pSVar2;
  OutOfMemoryException *this_00;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  allocator local_129;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8 [32];
  string extra_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  EvictionResult r;
  
  pBVar1 = this->buffer_pool;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pBVar1->maximum_memory).super___atomic_base<unsigned_long>._M_i;
  (*pBVar1->_vptr_BufferPool[3])
            (&r,pBVar1,CONCAT71(in_register_00000011,tag),memory_delta,params_1,buffer);
  if (r.success != false) {
    BufferPoolReservation::BufferPoolReservation
              (&__return_storage_ptr__->super_BufferPoolReservation,
               &r.reservation.super_BufferPoolReservation);
    TempBufferPoolReservation::~TempBufferPoolReservation(&r.reservation);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string(local_c8," (%s/%s used)",(allocator *)&local_128);
  pSVar2 = (StringUtil *)GetUsedMemory(this);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_e8,pSVar2,0x400,memory_delta);
  pSVar2 = (StringUtil *)GetMaxMemory(this);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_108,pSVar2,0x400,memory_delta);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&extra_text,(StringUtil *)local_c8,&local_e8,&local_108,params_1);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::__cxx11::string::~string(local_c8);
  ::std::__cxx11::string::append((char *)&extra_text);
  this_00 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_128,args,&local_129);
  ::std::__cxx11::string::string((string *)&local_68,(string *)args_1._M_dataplus._M_p);
  ::std::__cxx11::string::string((string *)&local_88,(string *)&extra_text);
  OutOfMemoryException::OutOfMemoryException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_128,&local_68,&local_88);
  __cxa_throw(this_00,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TempBufferPoolReservation StandardBufferManager::EvictBlocksOrThrow(MemoryTag tag, idx_t memory_delta,
                                                                    unique_ptr<FileBuffer> *buffer, ARGS... args) {
	auto r = buffer_pool.EvictBlocks(tag, memory_delta, buffer_pool.maximum_memory, buffer);
	if (!r.success) {
		string extra_text = StringUtil::Format(" (%s/%s used)", StringUtil::BytesToHumanReadableString(GetUsedMemory()),
		                                       StringUtil::BytesToHumanReadableString(GetMaxMemory()));
		extra_text += InMemoryWarning();
		throw OutOfMemoryException(args..., extra_text);
	}
	return std::move(r.reservation);
}